

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.hpp
# Opt level: O0

IterTraits<Lib::MappingIterator<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:216:22),_Kernel::SelectedSummand>_>
* __thiscall
Kernel::AlascaState::maxSummands(AlascaState *this,SelectedLiteral *sel_lit,SelectionCriterion sel)

{
  anon_class_16_2_633bab87 f;
  SelectedLiteral *in_RDX;
  anon_class_48_1_f93f0412_for__func *in_RSI;
  AlascaState *in_RDI;
  SelectedLiteral *in_stack_fffffffffffffe58;
  AlascaState *pAVar1;
  Coproduct<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>
  *in_stack_ffffffffffffff88;
  anon_class_48_1_f93f0412_for__func *f_00;
  AlascaState *this_00;
  
  pAVar1 = in_RDI;
  f_00 = in_RSI;
  this_00 = in_RDI;
  Lib::
  OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::unwrap((OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            *)0x3a8a46);
  f.sel = (SelectionCriterion *)in_RSI;
  f.this = pAVar1;
  Lib::
  Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>>>
  ::
  applyCo<Kernel::AlascaState::maxSummands(Kernel::SelectedLiteral,Kernel::OrderingUtils::SelectionCriterion)::_lambda(auto:1&)_1_>
            ((Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
              *)in_RDI,f);
  Lib::
  coproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int,unsigned_int)_1_,Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int)_1_>(unsigned_int,Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int,unsigned_int)_1_,Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Ker___l::RealConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::_lambda(auto:1&)_1_,false>>>
            (in_stack_ffffffffffffff88);
  SelectedLiteral::SelectedLiteral(in_RDX,in_stack_fffffffffffffe58);
  Lib::
  IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1}>(unsigned_int,Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::A...::RealConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::{lambda(auto:1&)#1},false>>>>
  ::
  map<Kernel::AlascaState::maxSummands(Kernel::SelectedLiteral,Kernel::OrderingUtils::SelectionCriterion)::_lambda(auto:1)_1_>
            ((IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>_>
              *)this_00,f_00);
  maxSummands(Kernel::SelectedLiteral,Kernel::OrderingUtils::SelectionCriterion)::{lambda(auto:1)#1}
  ::~SelectionCriterion((anon_class_48_1_f93f0412_for__func *)0x3a8ac4);
  Lib::
  IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:107:26),_false>_>_>_>
  ::~IterTraits((IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>_>
                 *)0x3a8ad1);
  Lib::
  Coproduct<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:107:26),_false>_>_>
  ::~Coproduct((Coproduct<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>
                *)0x3a8ade);
  return (IterTraits<Lib::MappingIterator<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:216:22),_Kernel::SelectedSummand>_>
          *)pAVar1;
}

Assistant:

auto maxSummands(SelectedLiteral sel_lit , SelectionCriterion sel) 
    { return coproductIter(sel_lit.interpreted.unwrap()
                .applyCo([&](auto& lit) 
                       { return maxSummandIndices(lit, sel); }))
                .map([=](auto i) 
                     { return SelectedSummand(sel_lit, i); }); }